

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError Pm_SetFilter(PortMidiStream *stream,int32_t filters)

{
  PmError PVar1;
  
  PVar1 = pmBadPtr;
  if ((stream != (PortMidiStream *)0x0) && (descriptors[*stream].pub.opened != 0)) {
    *(int32_t *)((long)stream + 0x38) = filters;
    PVar1 = pmNoData;
  }
  return PVar1;
}

Assistant:

PMEXPORT PmError Pm_SetFilter(PortMidiStream *stream, int32_t filters) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    /* arg checking */
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        midi->filters = filters;
    return pm_errmsg(err);
}